

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_sse41_128_16.c
# Opt level: O1

parasail_result_t *
parasail_sw_diag_sse41_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  short sVar1;
  int *piVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  int16_t *ptr;
  int iVar13;
  int iVar14;
  parasail_result_t *ppVar15;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  long lVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  int16_t iVar27;
  short sVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  undefined8 unaff_R15;
  short sVar36;
  undefined4 uVar37;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  short sVar42;
  short sVar48;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  ushort uVar65;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  undefined1 auVar66 [16];
  __m128i vMaxH;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  short local_108;
  short sStack_106;
  undefined1 local_f8 [16];
  int16_t *local_e0;
  undefined1 local_d8 [16];
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  uint local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  uint local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [16];
  ulong local_70;
  ulong local_68;
  int *local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar54;
  short sVar57;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_diag_sse41_128_16_cold_7();
  }
  else if (s2Len < 1) {
    parasail_sw_diag_sse41_128_16_cold_6();
  }
  else if (open < 0) {
    parasail_sw_diag_sse41_128_16_cold_5();
  }
  else if (gap < 0) {
    parasail_sw_diag_sse41_128_16_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sw_diag_sse41_128_16_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_sw_diag_sse41_128_16_cold_2();
        return (parasail_result_t *)0x0;
      }
      uVar34 = (ulong)(uint)_s1Len;
      if (_s1Len < 1) {
        parasail_sw_diag_sse41_128_16_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      uVar34 = (ulong)(uint)matrix->length;
    }
    iVar14 = matrix->min;
    iVar19 = -iVar14;
    if (iVar14 != -open && SBORROW4(iVar14,-open) == iVar14 + open < 0) {
      iVar19 = open;
    }
    uVar23 = iVar19 - 0x7fff;
    iVar14 = matrix->max;
    auVar38 = pshuflw(ZEXT416(uVar23),ZEXT416(uVar23),0);
    uVar37 = auVar38._0_4_;
    local_88._4_4_ = uVar37;
    local_88._0_4_ = uVar37;
    local_88._8_4_ = uVar37;
    local_88._12_4_ = uVar37;
    local_f8._4_4_ = uVar37;
    local_f8._0_4_ = uVar37;
    local_f8._8_4_ = uVar37;
    local_f8._12_4_ = uVar37;
    local_108 = auVar38._0_2_;
    sStack_106 = auVar38._2_2_;
    local_d8._4_4_ = uVar37;
    local_d8._0_4_ = uVar37;
    local_d8._8_4_ = uVar37;
    local_d8._12_4_ = uVar37;
    ppVar15 = parasail_result_new();
    if (ppVar15 != (parasail_result_t *)0x0) {
      local_a8 = (uint)CONCAT62((int6)((ulong)unaff_R15 >> 0x10),0x7ffe - (short)iVar14);
      ppVar15->flag = ppVar15->flag | 0x8201004;
      uVar35 = (ulong)(s2Len + 0xe);
      local_98 = open;
      ptr_00 = parasail_memalign_int16_t(0x10,uVar35);
      ptr_01 = parasail_memalign_int16_t(0x10,uVar35);
      ptr_02 = parasail_memalign_int16_t(0x10,uVar35);
      if (ptr_02 != (int16_t *)0x0 && (ptr_01 != (int16_t *)0x0 && ptr_00 != (int16_t *)0x0)) {
        uVar31 = (uint)uVar34;
        if (matrix->type == 0) {
          iVar14 = uVar31 + 7;
          local_b8 = gap;
          local_e0 = parasail_memalign_int16_t(0x10,(long)iVar14);
          if (local_e0 == (int16_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < (int)uVar31) {
            piVar6 = matrix->mapper;
            uVar35 = 0;
            do {
              local_e0[uVar35] = (int16_t)piVar6[(byte)_s1[uVar35]];
              uVar35 = uVar35 + 1;
            } while (uVar34 != uVar35);
          }
          iVar19 = uVar31 + 1;
          if ((int)(uVar31 + 1) < iVar14) {
            iVar19 = iVar14;
          }
          memset(local_e0 + (int)uVar31,0,(ulong)(~uVar31 + iVar19) * 2 + 2);
        }
        else {
          local_e0 = (int16_t *)0x0;
          local_b8 = gap;
        }
        uVar29 = s2Len + 7;
        auVar38 = pshuflw(ZEXT416(local_a8),ZEXT416(local_a8),0);
        local_c8 = auVar38._0_2_;
        sStack_c6 = auVar38._2_2_;
        auVar38._4_2_ = local_108;
        auVar38._0_4_ = uVar37;
        auVar38._6_2_ = sStack_106;
        auVar38._8_2_ = local_108;
        auVar38._10_2_ = sStack_106;
        auVar38._12_2_ = local_108;
        auVar38._14_2_ = sStack_106;
        local_48 = pblendw((undefined1  [16])0x0,auVar38,0x7f);
        auVar38 = pshuflw(ZEXT416(local_98),ZEXT416(local_98),0);
        local_98 = auVar38._0_4_;
        auVar38 = pshuflw(ZEXT416(local_b8),ZEXT416(local_b8),0);
        local_a8 = auVar38._0_4_;
        auVar38 = pshuflw(ZEXT416(uVar31),ZEXT416(uVar31),0);
        local_58 = auVar38._0_4_;
        auVar38 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
        local_b8 = auVar38._0_4_;
        piVar6 = matrix->mapper;
        uVar35 = 1;
        if (1 < s2Len) {
          uVar35 = (ulong)(uint)s2Len;
        }
        uVar20 = 0;
        do {
          ptr_00[uVar20 + 7] = (int16_t)piVar6[(byte)_s2[uVar20]];
          uVar20 = uVar20 + 1;
        } while (uVar35 != uVar20);
        uVar20 = 0;
        ptr_00[3] = 0;
        ptr_00[4] = 0;
        ptr_00[5] = 0;
        ptr_00[6] = 0;
        ptr_00[0] = 0;
        ptr_00[1] = 0;
        ptr_00[2] = 0;
        ptr_00[3] = 0;
        uVar32 = s2Len + 1U;
        if ((int)(s2Len + 1U) < (int)uVar29) {
          uVar32 = uVar29;
        }
        sStack_c4 = local_c8;
        sStack_c2 = sStack_c6;
        sStack_c0 = local_c8;
        sStack_be = sStack_c6;
        sStack_bc = local_c8;
        sStack_ba = sStack_c6;
        uStack_b4 = local_b8;
        uStack_b0 = local_b8;
        uStack_ac = local_b8;
        uStack_a4 = local_a8;
        uStack_a0 = local_a8;
        uStack_9c = local_a8;
        uStack_94 = local_98;
        uStack_90 = local_98;
        uStack_8c = local_98;
        uStack_54 = local_58;
        uStack_50 = local_58;
        uStack_4c = local_58;
        memset(ptr_00 + (ulong)(uint)s2Len + 7,0,(ulong)(~s2Len + uVar32) * 2 + 2);
        ptr = local_e0;
        do {
          ptr_01[uVar20 + 7] = 0;
          iVar27 = (int16_t)uVar23;
          ptr_02[uVar20 + 7] = iVar27;
          uVar20 = uVar20 + 1;
        } while (uVar35 != uVar20);
        lVar16 = 0;
        do {
          ptr_01[lVar16] = iVar27;
          ptr_02[lVar16] = iVar27;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 7);
        lVar16 = (ulong)(uint)s2Len + 7;
        do {
          ptr_01[lVar16] = iVar27;
          ptr_02[lVar16] = iVar27;
          lVar16 = lVar16 + 1;
          s2Len = s2Len + 1;
        } while (s2Len < (int)uVar29);
        local_138._0_2_ = local_108;
        local_138._2_2_ = sStack_106;
        local_138._4_2_ = local_108;
        local_138._6_2_ = sStack_106;
        uStack_130._0_2_ = local_108;
        uStack_130._2_2_ = sStack_106;
        uStack_130._4_2_ = local_108;
        uStack_130._6_2_ = sStack_106;
        local_148._0_2_ = local_c8;
        local_148._2_2_ = sStack_c6;
        local_148._4_2_ = sStack_c4;
        local_148._6_2_ = sStack_c2;
        uStack_140._0_2_ = sStack_c0;
        uStack_140._2_2_ = sStack_be;
        uStack_140._4_2_ = sStack_bc;
        uStack_140._6_2_ = sStack_ba;
        if (0 < (int)uVar31) {
          local_60 = matrix->matrix;
          iVar14 = matrix->size;
          iVar19 = matrix->type;
          uVar31 = uVar31 - 1;
          local_68 = 1;
          if (1 < (int)uVar29) {
            local_68 = (ulong)uVar29;
          }
          auVar38 = pmovsxbw(in_XMM6,0x1020304050607);
          uVar35 = 0;
          local_148 = CONCAT26(sStack_c2,CONCAT24(sStack_c4,CONCAT22(sStack_c6,local_c8)));
          uStack_140 = CONCAT26(sStack_ba,CONCAT24(sStack_bc,CONCAT22(sStack_be,sStack_c0)));
          local_138 = CONCAT26(sStack_106,CONCAT24(local_108,uVar37));
          uStack_130 = CONCAT26(sStack_106,CONCAT24(local_108,uVar37));
          local_70 = uVar34;
          do {
            uVar32 = (uint)uVar35;
            uVar29 = uVar32;
            if (iVar19 == 0) {
              uVar29 = (uint)local_e0[uVar35];
            }
            if (iVar19 == 0) {
              uVar17 = (int)local_e0[uVar35 | 1];
            }
            else {
              uVar17 = uVar32 | 1;
              if (uVar34 <= (uVar35 | 1)) {
                uVar17 = uVar31;
              }
            }
            if (iVar19 == 0) {
              uVar24 = (int)local_e0[uVar35 | 2];
            }
            else {
              uVar24 = uVar32 | 2;
              if (uVar34 <= (uVar35 | 2)) {
                uVar24 = uVar31;
              }
            }
            if (iVar19 == 0) {
              uVar22 = (int)local_e0[uVar35 | 3];
            }
            else {
              uVar22 = uVar32 | 3;
              if (uVar34 <= (uVar35 | 3)) {
                uVar22 = uVar31;
              }
            }
            if (iVar19 == 0) {
              uVar33 = (int)local_e0[uVar35 | 4];
            }
            else {
              uVar33 = uVar32 | 4;
              if (uVar34 <= (uVar35 | 4)) {
                uVar33 = uVar31;
              }
            }
            if (iVar19 == 0) {
              uVar30 = (int)local_e0[uVar35 | 5];
            }
            else {
              uVar30 = uVar32 | 5;
              if (uVar34 <= (uVar35 | 5)) {
                uVar30 = uVar31;
              }
            }
            if (iVar19 == 0) {
              uVar21 = (int)local_e0[uVar35 | 6];
            }
            else {
              uVar21 = uVar32 | 6;
              if (uVar34 <= (uVar35 | 6)) {
                uVar21 = uVar31;
              }
            }
            if (iVar19 == 0) {
              uVar32 = (int)local_e0[uVar35 | 7];
            }
            else {
              uVar32 = uVar32 | 7;
              if (uVar34 <= (uVar35 | 7)) {
                uVar32 = uVar31;
              }
            }
            auVar59._0_2_ = -(ushort)(auVar38._0_2_ < (short)local_58);
            auVar59._2_2_ = -(ushort)(auVar38._2_2_ < local_58._2_2_);
            auVar59._4_2_ = -(ushort)(auVar38._4_2_ < (short)uStack_54);
            auVar59._6_2_ = -(ushort)(auVar38._6_2_ < uStack_54._2_2_);
            auVar59._8_2_ = -(ushort)(auVar38._8_2_ < (short)uStack_50);
            auVar59._10_2_ = -(ushort)(auVar38._10_2_ < uStack_50._2_2_);
            auVar59._12_2_ = -(ushort)(auVar38._12_2_ < (short)uStack_4c);
            auVar59._14_2_ = -(ushort)(auVar38._14_2_ < uStack_4c._2_2_);
            uVar20 = 0;
            in_XMM9 = pmovsxbw(in_XMM9,0xfffefdfcfbfaf9);
            auVar55._4_2_ = local_108;
            auVar55._0_4_ = uVar37;
            auVar55._6_2_ = sStack_106;
            auVar55._8_2_ = local_108;
            auVar55._10_2_ = sStack_106;
            auVar55._12_2_ = local_108;
            auVar55._14_2_ = sStack_106;
            auVar52 = local_48;
            auVar58 = local_48;
            auVar64 = auVar55;
            do {
              auVar49._10_2_ =
                   (short)local_60[(long)(int)(uVar24 * iVar14) + (long)ptr_00[uVar20 + 5]];
              auVar49._8_2_ =
                   (short)local_60[(long)(int)(uVar22 * iVar14) + (long)ptr_00[uVar20 + 4]];
              auVar49._12_2_ =
                   (short)local_60[(long)(int)(uVar17 * iVar14) + (long)ptr_00[uVar20 + 6]];
              auVar49._14_2_ =
                   (short)local_60[(long)(int)(uVar29 * iVar14) + (long)ptr_00[uVar20 + 7]];
              auVar49._0_8_ =
                   (ulong)(uint)local_60[(long)(int)(uVar32 * iVar14) + (long)ptr_00[uVar20]] &
                   0xffffffff0000ffff |
                   (ulong)*(ushort *)
                           (local_60 + (long)(int)(uVar21 * iVar14) + (long)ptr_00[uVar20 + 1]) <<
                   0x10 | (ulong)*(ushort *)
                                  (local_60 +
                                  (long)(int)(uVar30 * iVar14) + (long)ptr_00[uVar20 + 2]) << 0x20 |
                   (ulong)*(ushort *)
                           (local_60 + (long)(int)(uVar33 * iVar14) + (long)ptr_00[uVar20 + 3]) <<
                   0x30;
              auVar39 = paddsw(auVar49,auVar58);
              auVar58._0_8_ = auVar52._2_8_;
              auVar58._8_8_ = auVar52._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar20 + 7] << 0x30;
              auVar61._0_8_ = auVar64._2_8_;
              auVar61._8_8_ = auVar64._8_8_ >> 0x10 | (ulong)(ushort)ptr_02[uVar20 + 7] << 0x30;
              auVar60._4_4_ = uStack_94;
              auVar60._0_4_ = local_98;
              auVar60._8_4_ = uStack_90;
              auVar60._12_4_ = uStack_8c;
              auVar49 = psubsw(auVar58,auVar60);
              auVar64._4_4_ = uStack_a4;
              auVar64._0_4_ = local_a8;
              auVar64._8_4_ = uStack_a0;
              auVar64._12_4_ = uStack_9c;
              auVar62 = psubsw(auVar61,auVar64);
              sVar28 = auVar49._0_2_;
              sVar54 = auVar62._0_2_;
              auVar63._0_2_ =
                   (ushort)(sVar54 < sVar28) * sVar28 | (ushort)(sVar54 >= sVar28) * sVar54;
              sVar28 = auVar49._2_2_;
              sVar54 = auVar62._2_2_;
              auVar63._2_2_ =
                   (ushort)(sVar54 < sVar28) * sVar28 | (ushort)(sVar54 >= sVar28) * sVar54;
              sVar28 = auVar49._4_2_;
              sVar54 = auVar62._4_2_;
              auVar63._4_2_ =
                   (ushort)(sVar54 < sVar28) * sVar28 | (ushort)(sVar54 >= sVar28) * sVar54;
              sVar28 = auVar49._6_2_;
              sVar54 = auVar62._6_2_;
              auVar63._6_2_ =
                   (ushort)(sVar54 < sVar28) * sVar28 | (ushort)(sVar54 >= sVar28) * sVar54;
              sVar28 = auVar49._8_2_;
              sVar54 = auVar62._8_2_;
              auVar63._8_2_ =
                   (ushort)(sVar54 < sVar28) * sVar28 | (ushort)(sVar54 >= sVar28) * sVar54;
              sVar28 = auVar49._10_2_;
              sVar54 = auVar62._10_2_;
              auVar63._10_2_ =
                   (ushort)(sVar54 < sVar28) * sVar28 | (ushort)(sVar54 >= sVar28) * sVar54;
              sVar28 = auVar49._12_2_;
              sVar54 = auVar62._12_2_;
              sVar57 = auVar62._14_2_;
              auVar63._12_2_ =
                   (ushort)(sVar54 < sVar28) * sVar28 | (ushort)(sVar54 >= sVar28) * sVar54;
              sVar28 = auVar49._14_2_;
              auVar63._14_2_ =
                   (ushort)(sVar57 < sVar28) * sVar28 | (ushort)(sVar57 >= sVar28) * sVar57;
              auVar52 = psubsw(auVar52,auVar60);
              auVar55 = psubsw(auVar55,auVar64);
              sVar28 = auVar52._0_2_;
              sVar54 = auVar55._0_2_;
              auVar56._0_2_ =
                   (ushort)(sVar54 < sVar28) * sVar28 | (ushort)(sVar54 >= sVar28) * sVar54;
              sVar28 = auVar52._2_2_;
              sVar54 = auVar55._2_2_;
              auVar56._2_2_ =
                   (ushort)(sVar54 < sVar28) * sVar28 | (ushort)(sVar54 >= sVar28) * sVar54;
              sVar28 = auVar52._4_2_;
              sVar54 = auVar55._4_2_;
              auVar56._4_2_ =
                   (ushort)(sVar54 < sVar28) * sVar28 | (ushort)(sVar54 >= sVar28) * sVar54;
              sVar28 = auVar52._6_2_;
              sVar54 = auVar55._6_2_;
              auVar56._6_2_ =
                   (ushort)(sVar54 < sVar28) * sVar28 | (ushort)(sVar54 >= sVar28) * sVar54;
              sVar28 = auVar52._8_2_;
              sVar54 = auVar55._8_2_;
              auVar56._8_2_ =
                   (ushort)(sVar54 < sVar28) * sVar28 | (ushort)(sVar54 >= sVar28) * sVar54;
              sVar28 = auVar52._10_2_;
              sVar54 = auVar55._10_2_;
              auVar56._10_2_ =
                   (ushort)(sVar54 < sVar28) * sVar28 | (ushort)(sVar54 >= sVar28) * sVar54;
              sVar28 = auVar52._12_2_;
              sVar54 = auVar55._12_2_;
              sVar57 = auVar55._14_2_;
              auVar56._12_2_ =
                   (ushort)(sVar54 < sVar28) * sVar28 | (ushort)(sVar54 >= sVar28) * sVar54;
              sVar28 = auVar52._14_2_;
              auVar56._14_2_ =
                   (ushort)(sVar57 < sVar28) * sVar28 | (ushort)(sVar57 >= sVar28) * sVar57;
              uVar65 = ((short)auVar56._0_2_ < (short)auVar63._0_2_) * auVar63._0_2_ |
                       ((short)auVar56._0_2_ >= (short)auVar63._0_2_) * auVar56._0_2_;
              uVar67 = ((short)auVar56._2_2_ < (short)auVar63._2_2_) * auVar63._2_2_ |
                       ((short)auVar56._2_2_ >= (short)auVar63._2_2_) * auVar56._2_2_;
              uVar68 = ((short)auVar56._4_2_ < (short)auVar63._4_2_) * auVar63._4_2_ |
                       ((short)auVar56._4_2_ >= (short)auVar63._4_2_) * auVar56._4_2_;
              uVar69 = ((short)auVar56._6_2_ < (short)auVar63._6_2_) * auVar63._6_2_ |
                       ((short)auVar56._6_2_ >= (short)auVar63._6_2_) * auVar56._6_2_;
              uVar70 = ((short)auVar56._8_2_ < (short)auVar63._8_2_) * auVar63._8_2_ |
                       ((short)auVar56._8_2_ >= (short)auVar63._8_2_) * auVar56._8_2_;
              uVar71 = ((short)auVar56._10_2_ < (short)auVar63._10_2_) * auVar63._10_2_ |
                       ((short)auVar56._10_2_ >= (short)auVar63._10_2_) * auVar56._10_2_;
              uVar72 = ((short)auVar56._12_2_ < (short)auVar63._12_2_) * auVar63._12_2_ |
                       ((short)auVar56._12_2_ >= (short)auVar63._12_2_) * auVar56._12_2_;
              uVar73 = ((short)auVar56._14_2_ < (short)auVar63._14_2_) * auVar63._14_2_ |
                       ((short)auVar56._14_2_ >= (short)auVar63._14_2_) * auVar56._14_2_;
              sVar1 = (-1 < (short)uVar65) * uVar65;
              sVar28 = (-1 < (short)uVar67) * uVar67;
              sVar54 = (-1 < (short)uVar68) * uVar68;
              sVar57 = (-1 < (short)uVar69) * uVar69;
              sVar2 = (-1 < (short)uVar70) * uVar70;
              sVar3 = (-1 < (short)uVar71) * uVar71;
              sVar4 = (-1 < (short)uVar72) * uVar72;
              sVar5 = (-1 < (short)uVar73) * uVar73;
              sVar36 = auVar39._0_2_;
              auVar66._0_2_ = (ushort)(sVar1 < sVar36) * sVar36 | (ushort)(sVar1 >= sVar36) * sVar1;
              sVar1 = auVar39._2_2_;
              auVar66._2_2_ = (ushort)(sVar28 < sVar1) * sVar1 | (ushort)(sVar28 >= sVar1) * sVar28;
              sVar28 = auVar39._4_2_;
              auVar66._4_2_ =
                   (ushort)(sVar54 < sVar28) * sVar28 | (ushort)(sVar54 >= sVar28) * sVar54;
              sVar28 = auVar39._6_2_;
              auVar66._6_2_ =
                   (ushort)(sVar57 < sVar28) * sVar28 | (ushort)(sVar57 >= sVar28) * sVar57;
              sVar28 = auVar39._8_2_;
              auVar66._8_2_ = (ushort)(sVar2 < sVar28) * sVar28 | (ushort)(sVar2 >= sVar28) * sVar2;
              sVar28 = auVar39._10_2_;
              auVar66._10_2_ = (ushort)(sVar3 < sVar28) * sVar28 | (ushort)(sVar3 >= sVar28) * sVar3
              ;
              sVar28 = auVar39._12_2_;
              auVar66._12_2_ = (ushort)(sVar4 < sVar28) * sVar28 | (ushort)(sVar4 >= sVar28) * sVar4
              ;
              sVar28 = auVar39._14_2_;
              auVar66._14_2_ = (ushort)(sVar5 < sVar28) * sVar28 | (ushort)(sVar5 >= sVar28) * sVar5
              ;
              sVar36 = in_XMM9._0_2_;
              auVar62._0_2_ = -(ushort)(sVar36 == -1);
              sVar42 = in_XMM9._2_2_;
              auVar62._2_2_ = -(ushort)(sVar42 == -1);
              sVar43 = in_XMM9._4_2_;
              auVar62._4_2_ = -(ushort)(sVar43 == -1);
              sVar44 = in_XMM9._6_2_;
              auVar62._6_2_ = -(ushort)(sVar44 == -1);
              sVar45 = in_XMM9._8_2_;
              auVar62._8_2_ = -(ushort)(sVar45 == -1);
              sVar46 = in_XMM9._10_2_;
              auVar62._10_2_ = -(ushort)(sVar46 == -1);
              sVar47 = in_XMM9._12_2_;
              sVar48 = in_XMM9._14_2_;
              auVar62._12_2_ = -(ushort)(sVar47 == -1);
              auVar62._14_2_ = -(ushort)(sVar48 == -1);
              auVar52 = ~auVar62 & auVar66;
              auVar39._4_2_ = local_108;
              auVar39._0_4_ = uVar37;
              auVar39._6_2_ = sStack_106;
              auVar39._8_2_ = local_108;
              auVar39._10_2_ = sStack_106;
              auVar39._12_2_ = local_108;
              auVar39._14_2_ = sStack_106;
              auVar64 = pblendvb(auVar63,auVar39,auVar62);
              auVar55 = pblendvb(auVar56,auVar39,auVar62);
              sVar28 = auVar52._0_2_;
              sVar54 = auVar52._2_2_;
              sVar1 = auVar52._14_2_;
              sVar57 = auVar52._4_2_;
              sVar2 = auVar52._6_2_;
              sVar3 = auVar52._8_2_;
              sVar4 = auVar52._10_2_;
              sVar5 = auVar52._12_2_;
              if (7 < uVar20) {
                bVar7 = sVar28 < (short)local_148;
                uVar71 = (ushort)!bVar7 * (short)local_148;
                bVar8 = sVar54 < local_148._2_2_;
                uVar65 = (ushort)!bVar8 * local_148._2_2_;
                bVar9 = sVar57 < local_148._4_2_;
                uVar70 = (ushort)!bVar9 * local_148._4_2_;
                bVar10 = sVar3 < (short)uStack_140;
                uVar69 = (ushort)!bVar10 * (short)uStack_140;
                bVar11 = sVar4 < uStack_140._2_2_;
                uVar68 = (ushort)!bVar11 * uStack_140._2_2_;
                bVar12 = sVar5 < uStack_140._4_2_;
                uVar67 = (ushort)!bVar12 * uStack_140._4_2_;
                local_148 = CONCAT26((ushort)(sVar2 < local_148._6_2_) * sVar2 |
                                     (ushort)(sVar2 >= local_148._6_2_) * local_148._6_2_,
                                     CONCAT24((ushort)bVar9 * sVar57 | uVar70,
                                              CONCAT22((ushort)bVar8 * sVar54 | uVar65,
                                                       (ushort)bVar7 * sVar28 | uVar71)));
                uStack_140 = CONCAT26((ushort)(sVar1 < uStack_140._6_2_) * sVar1 |
                                      (ushort)(sVar1 >= uStack_140._6_2_) * uStack_140._6_2_,
                                      CONCAT24((ushort)bVar12 * sVar5 | uVar67,
                                               CONCAT22((ushort)bVar11 * sVar4 | uVar68,
                                                        (ushort)bVar10 * sVar3 | uVar69)));
                bVar7 = (short)local_138 < sVar28;
                uVar71 = (ushort)!bVar7 * (short)local_138;
                bVar8 = local_138._2_2_ < sVar54;
                uVar70 = (ushort)!bVar8 * local_138._2_2_;
                bVar9 = local_138._4_2_ < sVar57;
                uVar69 = (ushort)!bVar9 * local_138._4_2_;
                bVar10 = (short)uStack_130 < sVar3;
                uVar65 = (ushort)!bVar10 * (short)uStack_130;
                bVar11 = uStack_130._2_2_ < sVar4;
                uVar67 = (ushort)!bVar11 * uStack_130._2_2_;
                bVar12 = uStack_130._4_2_ < sVar5;
                uVar68 = (ushort)!bVar12 * uStack_130._4_2_;
                local_138 = CONCAT26((ushort)(local_138._6_2_ < sVar2) * sVar2 |
                                     (ushort)(local_138._6_2_ >= sVar2) * local_138._6_2_,
                                     CONCAT24((ushort)bVar9 * sVar57 | uVar69,
                                              CONCAT22((ushort)bVar8 * sVar54 | uVar70,
                                                       (ushort)bVar7 * sVar28 | uVar71)));
                uStack_130 = CONCAT26((ushort)(uStack_130._6_2_ < sVar1) * sVar1 |
                                      (ushort)(uStack_130._6_2_ >= sVar1) * uStack_130._6_2_,
                                      CONCAT24((ushort)bVar12 * sVar5 | uVar68,
                                               CONCAT22((ushort)bVar11 * sVar4 | uVar67,
                                                        (ushort)bVar10 * sVar3 | uVar65)));
              }
              ptr_01[uVar20] = sVar28;
              ptr_02[uVar20] = auVar64._0_2_;
              auVar40._0_2_ = -(ushort)(sVar36 < (short)local_b8);
              auVar40._2_2_ = -(ushort)(sVar42 < local_b8._2_2_);
              auVar40._4_2_ = -(ushort)(sVar43 < (short)uStack_b4);
              auVar40._6_2_ = -(ushort)(sVar44 < uStack_b4._2_2_);
              auVar40._8_2_ = -(ushort)(sVar45 < (short)uStack_b0);
              auVar40._10_2_ = -(ushort)(sVar46 < uStack_b0._2_2_);
              auVar40._12_2_ = -(ushort)(sVar47 < (short)uStack_ac);
              auVar40._14_2_ = -(ushort)(sVar48 < uStack_ac._2_2_);
              auVar39 = psraw(in_XMM9,0xf);
              auVar60 = ~auVar39 & auVar40 & auVar59;
              auVar41._0_2_ = -(ushort)(sVar28 == local_88._0_2_);
              auVar41._2_2_ = -(ushort)(sVar54 == local_88._2_2_);
              auVar41._4_2_ = -(ushort)(sVar57 == local_88._4_2_);
              auVar41._6_2_ = -(ushort)(sVar2 == local_88._6_2_);
              auVar41._8_2_ = -(ushort)(sVar3 == local_88._8_2_);
              auVar41._10_2_ = -(ushort)(sVar4 == local_88._10_2_);
              auVar41._12_2_ = -(ushort)(sVar5 == local_88._12_2_);
              auVar41._14_2_ = -(ushort)(sVar1 == local_88._14_2_);
              auVar53._0_2_ = -(ushort)(local_88._0_2_ < sVar28);
              auVar53._2_2_ = -(ushort)(local_88._2_2_ < sVar54);
              auVar53._4_2_ = -(ushort)(local_88._4_2_ < sVar57);
              auVar53._6_2_ = -(ushort)(local_88._6_2_ < sVar2);
              auVar53._8_2_ = -(ushort)(local_88._8_2_ < sVar3);
              auVar53._10_2_ = -(ushort)(local_88._10_2_ < sVar4);
              auVar53._12_2_ = -(ushort)(local_88._12_2_ < sVar5);
              auVar53._14_2_ = -(ushort)(local_88._14_2_ < sVar1);
              auVar51._0_2_ = -(ushort)(sVar36 < local_d8._0_2_);
              auVar51._2_2_ = -(ushort)(sVar42 < local_d8._2_2_);
              auVar51._4_2_ = -(ushort)(sVar43 < local_d8._4_2_);
              auVar51._6_2_ = -(ushort)(sVar44 < local_d8._6_2_);
              auVar51._8_2_ = -(ushort)(sVar45 < local_d8._8_2_);
              auVar51._10_2_ = -(ushort)(sVar46 < local_d8._10_2_);
              auVar51._12_2_ = -(ushort)(sVar47 < local_d8._12_2_);
              auVar51._14_2_ = -(ushort)(sVar48 < local_d8._14_2_);
              local_88 = pblendvb(local_88,auVar66,auVar53 & auVar60);
              auVar39 = pblendvb(auVar53 & auVar60,auVar60,auVar51 & auVar41);
              local_f8 = pblendvb(local_f8,auVar38,auVar39);
              local_d8 = pblendvb(local_d8,in_XMM9,(auVar51 & auVar41 | auVar53) & auVar60);
              in_XMM9 = paddsw(in_XMM9,_DAT_008d0b80);
              uVar20 = uVar20 + 1;
            } while (local_68 != uVar20);
            auVar38 = paddsw(auVar38,_DAT_008d0b90);
            uVar35 = uVar35 + 8;
          } while (uVar35 < uVar34);
        }
        lVar16 = 0;
        iVar13 = 0;
        iVar14 = 0;
        iVar18 = 0;
        iVar19 = 0;
        do {
          uVar65 = *(ushort *)(local_88 + lVar16 * 2);
          if ((short)(ushort)uVar23 < (short)uVar65) {
            uVar23 = (uint)uVar65;
            iVar14 = (int)*(short *)(local_f8 + lVar16 * 2);
            iVar19 = (int)*(short *)(local_d8 + lVar16 * 2);
            iVar18 = (int)*(short *)(local_d8 + lVar16 * 2);
            iVar13 = (int)*(short *)(local_f8 + lVar16 * 2);
          }
          else if (uVar65 == (ushort)uVar23) {
            iVar25 = (int)*(short *)(local_d8 + lVar16 * 2);
            if (iVar25 < iVar19) {
              iVar14 = (int)*(short *)(local_f8 + lVar16 * 2);
              iVar19 = iVar25;
              iVar18 = iVar25;
              iVar13 = (int)*(short *)(local_f8 + lVar16 * 2);
            }
            else if (iVar19 == iVar25) {
              iVar26 = (int)*(short *)(local_f8 + lVar16 * 2);
              iVar19 = iVar18;
              if (iVar26 < iVar14) {
                iVar19 = iVar25;
              }
              bVar7 = iVar26 <= iVar14;
              iVar14 = iVar13;
              iVar18 = iVar19;
              if (bVar7) {
                iVar14 = iVar26;
                iVar13 = iVar26;
              }
            }
          }
          sVar28 = (short)uVar23;
          lVar16 = lVar16 + 1;
        } while ((int)lVar16 != 8);
        auVar52._0_2_ = -(ushort)((short)local_148 < local_108);
        auVar52._2_2_ = -(ushort)(local_148._2_2_ < sStack_106);
        auVar52._4_2_ = -(ushort)(local_148._4_2_ < local_108);
        auVar52._6_2_ = -(ushort)(local_148._6_2_ < sStack_106);
        auVar52._8_2_ = -(ushort)((short)uStack_140 < local_108);
        auVar52._10_2_ = -(ushort)(uStack_140._2_2_ < sStack_106);
        auVar52._12_2_ = -(ushort)(uStack_140._4_2_ < local_108);
        auVar52._14_2_ = -(ushort)(uStack_140._6_2_ < sStack_106);
        auVar50._0_2_ = -(ushort)(local_c8 < (short)local_138);
        auVar50._2_2_ = -(ushort)(sStack_c6 < local_138._2_2_);
        auVar50._4_2_ = -(ushort)(sStack_c4 < local_138._4_2_);
        auVar50._6_2_ = -(ushort)(sStack_c2 < local_138._6_2_);
        auVar50._8_2_ = -(ushort)(sStack_c0 < (short)uStack_130);
        auVar50._10_2_ = -(ushort)(sStack_be < uStack_130._2_2_);
        auVar50._12_2_ = -(ushort)(sStack_bc < uStack_130._4_2_);
        auVar50._14_2_ = -(ushort)(sStack_ba < uStack_130._6_2_);
        auVar50 = auVar50 | auVar52;
        if ((((((((((((((((auVar50 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar50 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar50 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar50 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar50 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar50 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar50 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar50 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar50 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar50 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar50 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar50 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar50[0xf] < '\0') {
          *(byte *)&ppVar15->flag = (byte)ppVar15->flag | 0x40;
          sVar28 = 0;
          iVar19 = 0;
          iVar14 = 0;
        }
        ppVar15->score = (int)sVar28;
        ppVar15->end_query = iVar14;
        ppVar15->end_ref = iVar19;
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        if (matrix->type == 0) {
          parasail_free(ptr);
          return ppVar15;
        }
        return ppVar15;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 2); /* shift in a 0 */
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vZero = _mm_set1_epi16(0);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vJLimit = _mm_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m128i vIltLimit = _mm_cmplt_epi16(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            vWH = _mm_max_epi16(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi16(vJ, vNegOne),
                        _mm_cmplt_epi16(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi16(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi16(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi16(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
    }

    /* alignment ending position */
    {
        int16_t *t = (int16_t*)&vMaxH;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}